

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageNextXrEnumerateViewConfigurationViews
                   (XrInstance instance,XrSystemId systemId,
                   XrViewConfigurationType viewConfigurationType,uint32_t viewCapacityInput,
                   uint32_t *viewCountOutput,XrViewConfigurationView *views)

{
  XrResult XVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  XrResult result;
  XrViewConfigurationView *views_local;
  uint32_t *viewCountOutput_local;
  uint32_t viewCapacityInput_local;
  XrViewConfigurationType viewConfigurationType_local;
  XrSystemId systemId_local;
  XrInstance instance_local;
  
  pGVar2 = HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>::get
                     (&g_instance_info.
                       super_HandleInfoBase<XrInstance_T_*,_GenValidUsageXrInstanceInfo>,instance);
  XVar1 = (*pGVar2->dispatch_table->EnumerateViewConfigurationViews)
                    (instance,systemId,viewConfigurationType,viewCapacityInput,viewCountOutput,views
                    );
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrEnumerateViewConfigurationViews(
    XrInstance instance,
    XrSystemId systemId,
    XrViewConfigurationType viewConfigurationType,
    uint32_t viewCapacityInput,
    uint32_t* viewCountOutput,
    XrViewConfigurationView* views) {
    XrResult result = XR_SUCCESS;
    try {
        GenValidUsageXrInstanceInfo *gen_instance_info = g_instance_info.get(instance);
        result = gen_instance_info->dispatch_table->EnumerateViewConfigurationViews(instance, systemId, viewConfigurationType, viewCapacityInput, viewCountOutput, views);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}